

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EntityIdentifier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LE_EntityIdentifier::Encode(LE_EntityIdentifier *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  LE_EntityIdentifier *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8SiteID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8ApplicationID);
  KDataStream::operator<<(pKVar1,this->m_ui16EntityID);
  return;
}

Assistant:

void LE_EntityIdentifier::Encode( KDataStream & stream ) const
{
    stream << m_ui8SiteID
           << m_ui8ApplicationID
           << m_ui16EntityID;
}